

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

cmSourceFile * __thiscall cmTarget::AddSource(cmTarget *this,string *src,bool before)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var2;
  size_type sVar3;
  cmSourceFile *pcVar4;
  cmSourceFileLocation sfl;
  optional<cmListFileBacktrace> local_90;
  cmSourceFileLocation local_78;
  
  cmSourceFileLocation::cmSourceFileLocation
            (&local_78,
             ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile,src,Known);
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_pred<TargetPropertyEntryFinder>>
                    (*(undefined8 *)
                      &((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&(_Var1._M_head_impl)->Sources + 0x18))->
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ,*(pointer *)((long)&(_Var1._M_head_impl)->Sources + 0x20),&local_78);
  if (_Var2._M_current == *(pointer *)((long)&(_Var1._M_head_impl)->Sources + 0x20)) {
    _Var1._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    local_90.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
    super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
    super__Optional_payload_base<cmListFileBacktrace>._M_engaged = false;
    anon_unknown.dwarf_12e1861::UsageRequirementProperty::WriteDirect<cmValue>
              (&(_Var1._M_head_impl)->Sources,_Var1._M_head_impl,&local_90,(cmValue)src,
               Append - before);
    if (local_90.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
        super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
        super__Optional_payload_base<cmListFileBacktrace>._M_engaged == true) {
      local_90.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
      super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
      super__Optional_payload_base<cmListFileBacktrace>._M_engaged = false;
      if (local_90.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
          super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
          super__Optional_payload_base<cmListFileBacktrace>._M_payload._M_value.
          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_90.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
                   super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
                   super__Optional_payload_base<cmListFileBacktrace>._M_payload._M_value.
                   super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
  }
  sVar3 = cmGeneratorExpression::Find(src);
  if (sVar3 == 0xffffffffffffffff) {
    pcVar4 = cmMakefile::GetOrCreateSource
                       (((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile,
                        src,false,Known);
  }
  else {
    pcVar4 = (cmSourceFile *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.Name._M_dataplus._M_p != &local_78.Name.field_2) {
    operator_delete(local_78.Name._M_dataplus._M_p,local_78.Name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.Directory._M_dataplus._M_p != &local_78.Directory.field_2) {
    operator_delete(local_78.Directory._M_dataplus._M_p,
                    local_78.Directory.field_2._M_allocated_capacity + 1);
  }
  return pcVar4;
}

Assistant:

cmSourceFile* cmTarget::AddSource(const std::string& src, bool before)
{
  cmSourceFileLocation sfl(this->impl->Makefile, src,
                           cmSourceFileLocationKind::Known);
  auto const& sources = this->impl->Sources.Entries;
  if (std::find_if(sources.begin(), sources.end(),
                   TargetPropertyEntryFinder(sfl)) == sources.end()) {
    this->impl->Sources.WriteDirect(
      this->impl.get(), {}, cmValue(src),
      before ? UsageRequirementProperty::Action::Prepend
             : UsageRequirementProperty::Action::Append);
  }
  if (cmGeneratorExpression::Find(src) != std::string::npos) {
    return nullptr;
  }
  return this->impl->Makefile->GetOrCreateSource(
    src, false, cmSourceFileLocationKind::Known);
}